

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XercesXPath::parseExpression
          (XercesXPath *this,XMLStringPool *stringPool,XercesNamespaceResolver *scopeContext)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  unsigned_short uVar4;
  int iVar5;
  XMLSize_t XVar6;
  XPathException *pXVar7;
  RefVectorOf<xercesc_4_0::XercesStep> *pRVar8;
  RefVectorOf<xercesc_4_0::XercesLocationPath> *this_00;
  int *piVar9;
  uint *puVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XercesStep *pXVar11;
  XercesNodeTest *pXVar12;
  XercesLocationPath *pXVar13;
  XercesLocationPath *pXVar14;
  XMLSize_t XVar15;
  XMLSize_t local_288;
  XMLSize_t j;
  bool bFound;
  XercesLocationPath *newPath;
  XercesStep *step_8;
  XercesNodeTest *nodeTest_8;
  XMLSize_t stepsSize;
  XercesStep *step_7;
  XercesNodeTest *nodeTest_7;
  XercesStep *step_5;
  XercesNodeTest *nodeTest_5;
  QName aQName_1;
  XMLCh *localPart_1;
  XercesStep *step_6;
  XercesNodeTest *nodeTest_6;
  XMLCh *pXStack_1d0;
  uint uri_1;
  XMLCh *prefix_1;
  XercesStep *step_4;
  XercesNodeTest *nodeTest_4;
  XercesStep *step_2;
  XercesNodeTest *nodeTest_2;
  QName aQName;
  XMLCh *localPart;
  XercesStep *step_3;
  XercesNodeTest *nodeTest_3;
  XMLCh *pXStack_140;
  uint uri;
  XMLCh *prefix;
  XercesStep *step_1;
  XercesNodeTest *nodeTest_1;
  XMLSize_t XStack_120;
  bool isNamespaceAtt;
  XMLSize_t i_1;
  bool bFound_1;
  XercesLocationPath *newPath_1;
  XercesStep *step;
  XercesNodeTest *nodeTest;
  XMLSize_t stepsSize_1;
  bool isNamespace;
  XMLSize_t XStack_e8;
  int aToken;
  XMLSize_t i;
  Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_> janSteps;
  RefVectorOf<xercesc_4_0::XercesStep> *stepsVector;
  XMLSize_t tokenCount;
  bool firstTokenOfLocationPath;
  undefined1 local_b8 [8];
  XPathScannerForSchema scanner;
  ValueVectorOf<int> tokens;
  XMLSize_t length;
  XercesNamespaceResolver *scopeContext_local;
  XMLStringPool *stringPool_local;
  XercesXPath *this_local;
  
  XVar6 = XMLString::stringLen(this->fExpression);
  if (XVar6 != 0) {
    ValueVectorOf<int>::ValueVectorOf
              ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool,0x10,
               this->fMemoryManager,false);
    XPathScannerForSchema::XPathScannerForSchema((XPathScannerForSchema *)local_b8,stringPool);
    bVar2 = XPathScanner::scanExpression
                      ((XPathScanner *)local_b8,this->fExpression,0,XVar6,
                       (ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool);
    if (!bVar2) {
      pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
      XPathException::XPathException
                (pXVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                 ,0x18a,XPath_TokenNotSupported,this->fMemoryManager);
      __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
    }
    bVar2 = true;
    XVar6 = ValueVectorOf<int>::size((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool);
    pRVar8 = (RefVectorOf<xercesc_4_0::XercesStep> *)
             XMemory::operator_new(0x30,this->fMemoryManager);
    RefVectorOf<xercesc_4_0::XercesStep>::RefVectorOf(pRVar8,0x10,true,this->fMemoryManager);
    janSteps.fData = pRVar8;
    Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_>::Janitor
              ((Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_> *)&i,pRVar8);
    if (XVar6 != 0) {
      this_00 = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::XercesLocationPath>::RefVectorOf(this_00,8,true,this->fMemoryManager)
      ;
      this->fLocationPaths = this_00;
    }
    for (XStack_e8 = 0; XStack_e8 < XVar6; XStack_e8 = XStack_e8 + 1) {
      piVar9 = ValueVectorOf<int>::elementAt
                         ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool,XStack_e8);
      bVar3 = false;
      switch(*piVar9) {
      case 4:
        pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
        pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesStep::XercesStep(pXVar11,3,pXVar12);
        BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                  (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
        if (((bVar2) && (XStack_e8 + 1 < XVar6)) &&
           (piVar9 = ValueVectorOf<int>::elementAt
                               ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool,
                                XStack_e8 + 1), *piVar9 == 0x16)) {
          if (XStack_e8 + 1 == XVar6 - 1) {
            pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x25e,XPath_ExpectedStep2,this->fMemoryManager);
            __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
          }
          if ((XStack_e8 + 2 < XVar6) &&
             (piVar9 = ValueVectorOf<int>::elementAt
                                 ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool,
                                  XStack_e8 + 2), *piVar9 == 0x15)) {
            pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x266,XPath_NoForwardSlash,this->fMemoryManager);
            __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
          }
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
          pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar11,4,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                    (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
          XStack_e8 = XStack_e8 + 1;
        }
        bVar2 = false;
        break;
      default:
        bVar2 = false;
        break;
      case 6:
        goto switchD_0040b4b2_caseD_6;
      case 8:
        pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x210,XPath_NoDoubleColon,this->fMemoryManager);
        __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
      case 9:
        pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesNodeTest::XercesNodeTest(pXVar12,2,this->fMemoryManager);
        pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
        XercesStep::XercesStep(pXVar11,1,pXVar12);
        BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                  (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
        bVar2 = false;
        break;
      case 10:
        bVar3 = true;
      case 0xb:
        puVar10 = (uint *)ValueVectorOf<int>::elementAt
                                    ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool,
                                     XStack_e8 + 1);
        uVar1 = *puVar10;
        pXStack_1d0 = L"";
        nodeTest_6._4_4_ = this->fEmptyNamespaceId;
        if ((scopeContext != (XercesNamespaceResolver *)0x0) && (uVar1 != 0xffffffff)) {
          iVar5 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                            (stringPool,(ulong)uVar1);
          pXStack_1d0 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
          nodeTest_6._4_4_ =
               (**scopeContext->_vptr_XercesNamespaceResolver)(scopeContext,pXStack_1d0);
        }
        if (((uVar1 != 0xffffffff) && (scopeContext != (XercesNamespaceResolver *)0x0)) &&
           (nodeTest_6._4_4_ == this->fEmptyNamespaceId)) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x239,XPath_PrefixNoURI,pXStack_1d0,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        if (bVar3) {
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,pXStack_1d0,nodeTest_6._4_4_,this->fMemoryManager);
          pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar11,1,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                    (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
          XStack_e8 = XStack_e8 + 1;
        }
        else {
          XStack_e8 = XStack_e8 + 2;
          puVar10 = (uint *)ValueVectorOf<int>::elementAt
                                      ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool
                                       ,XStack_e8);
          iVar5 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                            (stringPool,(ulong)*puVar10);
          aQName_1.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_02,iVar5);
          QName::QName((QName *)&nodeTest_5,pXStack_1d0,(XMLCh *)aQName_1.fMemoryManager,
                       nodeTest_6._4_4_,this->fMemoryManager);
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,(QName *)&nodeTest_5);
          pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar11,1,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                    (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
          bVar2 = false;
          QName::~QName((QName *)&nodeTest_5);
        }
        break;
      case 0x15:
        if (XStack_e8 == 0) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x279,XPath_NoForwardSlashAtStart,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        if (bVar2) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x27e,XPath_NoSelectionOfRoot,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        if (XStack_e8 == XVar6 - 1) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x282,XPath_ExpectedStep3,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        piVar9 = ValueVectorOf<int>::elementAt
                           ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool,
                            XStack_e8 + 1);
        iVar5 = *piVar9;
        if (((iVar5 == 0x15) || (iVar5 == 0x16)) || (iVar5 == 0x17)) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x287,XPath_ExpectedStep3,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        bVar2 = false;
        break;
      case 0x16:
        pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x274,XPath_NoDoubleForwardSlash,this->fMemoryManager);
        __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
      case 0x17:
        if (XStack_e8 == 0) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x19e,XPath_NoUnionAtStart,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        XVar15 = BaseRefVectorOf<xercesc_4_0::XercesStep>::size
                           (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>);
        if (XVar15 == 0) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x1a4,XPath_NoMultipleUnion,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        pXVar11 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                            (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,0);
        uVar4 = XercesStep::getAxisType(pXVar11);
        if (uVar4 != 3) {
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
          pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar11,3,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::insertElementAt
                    (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11,0);
        }
        pXVar13 = (XercesLocationPath *)XMemory::operator_new(0x10,this->fMemoryManager);
        XercesLocationPath::XercesLocationPath(pXVar13,janSteps.fData);
        Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_>::orphan
                  ((Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_> *)&i);
        bVar2 = false;
        for (XStack_120 = 0;
            XVar15 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::size
                               (&this->fLocationPaths->
                                 super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>),
            XStack_120 < XVar15; XStack_120 = XStack_120 + 1) {
          pXVar14 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                              (&this->fLocationPaths->
                                super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,XStack_120);
          bVar3 = XercesLocationPath::operator==(pXVar14,pXVar13);
          if (bVar3) {
            bVar2 = true;
            break;
          }
        }
        if (bVar2) {
          if (pXVar13 != (XercesLocationPath *)0x0) {
            (*(pXVar13->super_XSerializable)._vptr_XSerializable[1])();
          }
        }
        else {
          BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::addElement
                    (&this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,
                     pXVar13);
        }
        pRVar8 = (RefVectorOf<xercesc_4_0::XercesStep> *)
                 XMemory::operator_new(0x30,this->fMemoryManager);
        RefVectorOf<xercesc_4_0::XercesStep>::RefVectorOf(pRVar8,0x10,true,this->fMemoryManager);
        janSteps.fData = pRVar8;
        Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_>::reset
                  ((Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_> *)&i,pRVar8);
        bVar2 = true;
        break;
      case 0x23:
        XStack_e8 = XStack_e8 + 1;
switchD_0040b4b2_caseD_6:
        if (XStack_e8 == XVar6 - 1) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x1c9,XPath_MissingAttr,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        XVar15 = XStack_e8 + 1;
        piVar9 = ValueVectorOf<int>::elementAt
                           ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool,XVar15);
        iVar5 = *piVar9;
        if (((iVar5 != 0xb) && (iVar5 != 9)) && (iVar5 != 10)) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x1d1,XPath_ExpectedToken1,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        bVar2 = false;
        if (iVar5 == 9) {
          pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesNodeTest::XercesNodeTest(pXVar12,2,this->fMemoryManager);
          pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
          XercesStep::XercesStep(pXVar11,2,pXVar12);
          BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                    (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
        }
        else {
          if (iVar5 == 10) {
            bVar2 = true;
          }
          else if (iVar5 != 0xb) goto LAB_0040c06a;
          puVar10 = (uint *)ValueVectorOf<int>::elementAt
                                      ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool
                                       ,XStack_e8 + 2);
          uVar1 = *puVar10;
          pXStack_140 = L"";
          nodeTest_3._4_4_ = this->fEmptyNamespaceId;
          if ((scopeContext != (XercesNamespaceResolver *)0x0) && (uVar1 != 0xffffffff)) {
            iVar5 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                              (stringPool,(ulong)uVar1);
            pXStack_140 = (XMLCh *)CONCAT44(extraout_var,iVar5);
            nodeTest_3._4_4_ =
                 (**scopeContext->_vptr_XercesNamespaceResolver)(scopeContext,pXStack_140);
          }
          if (((uVar1 != 0xffffffff) && (scopeContext != (XercesNamespaceResolver *)0x0)) &&
             (nodeTest_3._4_4_ == this->fEmptyNamespaceId)) {
            pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x1f1,XPath_PrefixNoURI,pXStack_140,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                       this->fMemoryManager);
            __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
          }
          if (bVar2) {
            pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
            XercesNodeTest::XercesNodeTest
                      (pXVar12,pXStack_140,nodeTest_3._4_4_,this->fMemoryManager);
            pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
            XercesStep::XercesStep(pXVar11,2,pXVar12);
            BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                      (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
            XVar15 = XStack_e8 + 2;
          }
          else {
            puVar10 = (uint *)ValueVectorOf<int>::elementAt
                                        ((ValueVectorOf<int> *)
                                         &scanner.super_XPathScanner.fStringPool,XStack_e8 + 3);
            iVar5 = (*(stringPool->super_XSerializable)._vptr_XSerializable[10])
                              (stringPool,(ulong)*puVar10);
            aQName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_00,iVar5);
            QName::QName((QName *)&nodeTest_2,pXStack_140,(XMLCh *)aQName.fMemoryManager,
                         nodeTest_3._4_4_,this->fMemoryManager);
            pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
            XercesNodeTest::XercesNodeTest(pXVar12,(QName *)&nodeTest_2);
            pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
            XercesStep::XercesStep(pXVar11,2,pXVar12);
            BaseRefVectorOf<xercesc_4_0::XercesStep>::addElement
                      (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11);
            QName::~QName((QName *)&nodeTest_2);
            XVar15 = XStack_e8 + 3;
          }
        }
LAB_0040c06a:
        XStack_e8 = XVar15;
        bVar2 = false;
        break;
      case 0x24:
        if (XStack_e8 + 1 == XVar6 - 1) {
          pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x218,XPath_ExpectedStep1,this->fMemoryManager);
          __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
        }
        bVar2 = false;
        XStack_e8 = XStack_e8 + 1;
      }
    }
    XVar6 = BaseRefVectorOf<xercesc_4_0::XercesStep>::size
                      (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>);
    if (XVar6 == 0) {
      if ((this->fLocationPaths != (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0) &&
         (XVar6 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::size
                            (&this->fLocationPaths->
                              super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>), XVar6 != 0))
      {
        pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
        XPathException::XPathException
                  (pXVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x298,XPath_NoUnionAtEnd,this->fMemoryManager);
        __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
      }
      pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
      XPathException::XPathException
                (pXVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                 ,0x295,XPath_EmptyExpr,this->fMemoryManager);
      __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
    }
    pXVar11 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                        (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,0);
    uVar4 = XercesStep::getAxisType(pXVar11);
    if (uVar4 != 3) {
      pXVar12 = (XercesNodeTest *)XMemory::operator_new(0x18,this->fMemoryManager);
      XercesNodeTest::XercesNodeTest(pXVar12,3,this->fMemoryManager);
      pXVar11 = (XercesStep *)XMemory::operator_new(0x18,this->fMemoryManager);
      XercesStep::XercesStep(pXVar11,3,pXVar12);
      BaseRefVectorOf<xercesc_4_0::XercesStep>::insertElementAt
                (&(janSteps.fData)->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,pXVar11,0);
    }
    pXVar13 = (XercesLocationPath *)XMemory::operator_new(0x10,this->fMemoryManager);
    XercesLocationPath::XercesLocationPath(pXVar13,janSteps.fData);
    Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_>::orphan
              ((Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_> *)&i);
    bVar2 = false;
    for (local_288 = 0;
        XVar6 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::size
                          (&this->fLocationPaths->
                            super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>),
        local_288 < XVar6; local_288 = local_288 + 1) {
      pXVar14 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                          (&this->fLocationPaths->
                            super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,local_288);
      bVar3 = XercesLocationPath::operator==(pXVar14,pXVar13);
      if (bVar3) {
        bVar2 = true;
        break;
      }
    }
    if (bVar2) {
      if (pXVar13 != (XercesLocationPath *)0x0) {
        (*(pXVar13->super_XSerializable)._vptr_XSerializable[1])();
      }
    }
    else {
      BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::addElement
                (&this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,
                 pXVar13);
    }
    Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_>::~Janitor
              ((Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::XercesStep>_> *)&i);
    XPathScannerForSchema::~XPathScannerForSchema((XPathScannerForSchema *)local_b8);
    ValueVectorOf<int>::~ValueVectorOf
              ((ValueVectorOf<int> *)&scanner.super_XPathScanner.fStringPool);
  }
  return;
}

Assistant:

void XercesXPath::parseExpression(XMLStringPool* const stringPool,
                                  XercesNamespaceResolver* const scopeContext) {

    XMLSize_t length = XMLString::stringLen(fExpression);

    if (!length) {
        return;
    }

    ValueVectorOf<int>                tokens(16, fMemoryManager);
    XPathScannerForSchema             scanner(stringPool);
    if(!scanner.scanExpression(fExpression, 0, length, &tokens))
        ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_TokenNotSupported, fMemoryManager);

    bool                              firstTokenOfLocationPath=true;
    XMLSize_t                         tokenCount = tokens.size();
    RefVectorOf<XercesStep>*          stepsVector = new (fMemoryManager) RefVectorOf<XercesStep>(16, true, fMemoryManager);
    Janitor<RefVectorOf<XercesStep> > janSteps(stepsVector);

    if (tokenCount) {
        fLocationPaths = new (fMemoryManager) RefVectorOf<XercesLocationPath>(8, true, fMemoryManager);
    }

    for (XMLSize_t i = 0; i < tokenCount; i++) {

        int  aToken = tokens.elementAt(i);
        bool isNamespace=false;

        switch (aToken) {
        case  XercesXPath::EXPRTOKEN_OPERATOR_UNION:
            {
                if (i == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoUnionAtStart, fMemoryManager);
                }

                XMLSize_t stepsSize = stepsVector->size();

                if (stepsSize == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoMultipleUnion, fMemoryManager);
                }

                if(stepsVector->elementAt(0)->getAxisType()!=XercesStep::AxisType_SELF)
                {
                    // prepend ./
                    XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                    XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
                    stepsVector->insertElementAt(step, 0);
                }
                XercesLocationPath* newPath = new (fMemoryManager) XercesLocationPath(stepsVector);
                janSteps.orphan();
                bool bFound=false;
                for(XMLSize_t i=0;i<fLocationPaths->size();i++)
                    if((*(fLocationPaths->elementAt(i)))==(*newPath))
                    {
                        bFound=true;
                        break;
                    }
                if(bFound)
                    delete newPath;
                else
                    fLocationPaths->addElement(newPath);
                stepsVector = new (fMemoryManager) RefVectorOf<XercesStep>(16, true, fMemoryManager);
                janSteps.reset(stepsVector);
                firstTokenOfLocationPath = true;
            }
            break;
        case XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE:
            {
                // consume "::" token and drop through
                i++;
            }
        case XercesXPath::EXPRTOKEN_ATSIGN:
            {
                // consume QName token
                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_MissingAttr, fMemoryManager);
                }

                aToken = tokens.elementAt(++i);

                if (aToken != XercesXPath::EXPRTOKEN_NAMETEST_QNAME
                    && aToken!= XercesXPath::EXPRTOKEN_NAMETEST_ANY
                    && aToken!= XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE) {
                        ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedToken1, fMemoryManager);
                }

                bool isNamespaceAtt=false;

                switch (aToken) {

                case XercesXPath::EXPRTOKEN_NAMETEST_ANY:
                    {
                        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_WILDCARD, fMemoryManager);
                        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                        stepsVector->addElement(step);
                        break;
                    }
                case XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE:
                    {
                        isNamespaceAtt = true;
                    }
                case XercesXPath::EXPRTOKEN_NAMETEST_QNAME:
                    {
                        aToken = tokens.elementAt(++i);

                        const XMLCh* prefix = XMLUni::fgZeroLenString;
                        unsigned int uri = fEmptyNamespaceId;

                        if (scopeContext && aToken != -1) {

                            prefix = stringPool->getValueForId(aToken);
                            uri = scopeContext->getNamespaceForPrefix(prefix);
                        }

                        if (aToken != -1 && scopeContext && uri == fEmptyNamespaceId) {
                            ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_PrefixNoURI, prefix, fMemoryManager);
                        }

                        if (isNamespaceAtt) {

                            // build step
                            XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(prefix, uri, fMemoryManager);
                            XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                            stepsVector->addElement(step);
                            break;
                        }

                        aToken = tokens.elementAt(++i);

                        const XMLCh* localPart = stringPool->getValueForId(aToken);
                        QName aQName(prefix, localPart, uri, fMemoryManager);

                        // build step
                        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(&aQName);
                        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_ATTRIBUTE, nodeTest);
                        stepsVector->addElement(step);
                        break;
                    }
				}

                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_DOUBLE_COLON:
            {
                // should never have a bare double colon
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoDoubleColon, fMemoryManager);
            }
        case XercesXPath::EXPRTOKEN_AXISNAME_CHILD:
            {
                // consume "::" token and drop through
                i++;

                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep1, fMemoryManager);
                }

                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_ANY:
            {
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_WILDCARD, fMemoryManager);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                stepsVector->addElement(step);
                firstTokenOfLocationPath = false;
                break;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE:
            {
                isNamespace=true;
            }
        case XercesXPath::EXPRTOKEN_NAMETEST_QNAME:
            {
                // consume QName token
                aToken = tokens.elementAt(++i);

                const XMLCh* prefix = XMLUni::fgZeroLenString;
                unsigned int uri = fEmptyNamespaceId;

                if (scopeContext && aToken != -1) {

                    prefix = stringPool->getValueForId(aToken);
                    uri = scopeContext->getNamespaceForPrefix(prefix);
                }

                if (aToken != -1 && scopeContext && uri == fEmptyNamespaceId) {
                    ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_PrefixNoURI, prefix, fMemoryManager);
                }

                if (isNamespace) {

                    // build step
                    XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(prefix, uri, fMemoryManager);
                    XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                    stepsVector->addElement(step);
                    break;
                }

                aToken = tokens.elementAt(++i);
                const XMLCh* localPart = stringPool->getValueForId(aToken);
                QName aQName(prefix, localPart, uri, fMemoryManager);

                // build step
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(&aQName);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_CHILD, nodeTest);
                stepsVector->addElement(step);
                firstTokenOfLocationPath = false;
                break;
            }
        case XercesXPath::EXPRTOKEN_PERIOD:
            {
                // build step
                XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
                stepsVector->addElement(step);

                if (firstTokenOfLocationPath && i+1 < tokenCount) {

                    aToken = tokens.elementAt(i+1);

                    if (aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH){

                        if (++i == tokenCount - 1) {
                            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep2, fMemoryManager);
                        }

                        if (i+1 < tokenCount)	{

                            aToken = tokens.elementAt(i+1);

                            if (aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH) {
                                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoForwardSlash, fMemoryManager);
                            }
                        }
                        // build step
                        nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
                        step = new (fMemoryManager) XercesStep(XercesStep::AxisType_DESCENDANT, nodeTest);
                        stepsVector->addElement(step);
                    }
                }
                firstTokenOfLocationPath=false;
                break;
            }
        case XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH:
            {
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoDoubleForwardSlash, fMemoryManager);
            }
        case XercesXPath::EXPRTOKEN_OPERATOR_SLASH:
            {
                if (i == 0) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoForwardSlashAtStart, fMemoryManager);
                }

                // keep on truckin'
                if (firstTokenOfLocationPath) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoSelectionOfRoot, fMemoryManager);
                }

                if (i == tokenCount - 1) {
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep3, fMemoryManager);
                }

                aToken = tokens.elementAt(i+1);
                if(aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH || aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH || aToken == XercesXPath::EXPRTOKEN_OPERATOR_UNION)
                    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_ExpectedStep3, fMemoryManager);

                firstTokenOfLocationPath=false;
                break;
            }
        default:
            firstTokenOfLocationPath=false;
        }
    }

    XMLSize_t stepsSize = stepsVector->size();

    if (stepsSize == 0) {
        if (!fLocationPaths || fLocationPaths->size() == 0) {
            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_EmptyExpr, fMemoryManager);
        }
        else {
            ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoUnionAtEnd, fMemoryManager);
        }
    }

    if(stepsVector->elementAt(0)->getAxisType()!=XercesStep::AxisType_SELF)
    {
        // prepend ./
        XercesNodeTest* nodeTest = new (fMemoryManager) XercesNodeTest(XercesNodeTest::NodeType_NODE, fMemoryManager);
        XercesStep* step = new (fMemoryManager) XercesStep(XercesStep::AxisType_SELF, nodeTest);
        stepsVector->insertElementAt(step, 0);
    }
    XercesLocationPath* newPath = new (fMemoryManager) XercesLocationPath(stepsVector);
    janSteps.orphan();
    bool bFound=false;
    for(XMLSize_t j=0;j<fLocationPaths->size();j++)
        if((*(fLocationPaths->elementAt(j)))==(*newPath))
        {
            bFound=true;
            break;
        }
    if(bFound)
        delete newPath;
    else
        fLocationPaths->addElement(newPath);
}